

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O0

bool __thiscall MipsParser::parseParameters(MipsParser *this,Parser *parser,tMipsOpcode *opcode)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  bool bVar6;
  Token *pTVar7;
  char *pcVar8;
  long lVar9;
  int local_64;
  undefined1 local_60 [4];
  int actualSize;
  MipsRegisterValue tempRegister;
  char *encoding;
  tMipsOpcode *opcode_local;
  Parser *parser_local;
  MipsParser *this_local;
  
  tempRegister._40_8_ = opcode->encoding;
  (this->immediate).primary.type = None;
  if ((this->hasFixedSecondaryImmediate & 1U) == 0) {
    (this->immediate).secondary.type = None;
  }
  if ((this->opcodeData).vfpuSize == -1) {
    if ((opcode->flags & 0x80000U) == 0) {
      if ((opcode->flags & 0x400000U) == 0) {
        if ((opcode->flags & 0x800000U) == 0) {
          if ((opcode->flags & 0x100000U) != 0) {
            (this->opcodeData).vfpuSize = 3;
          }
        }
        else {
          (this->opcodeData).vfpuSize = 2;
        }
      }
      else {
        (this->opcodeData).vfpuSize = 1;
      }
    }
    else {
      (this->opcodeData).vfpuSize = 0;
    }
  }
  MipsRegisterValue::MipsRegisterValue((MipsRegisterValue *)local_60);
  local_64 = (this->opcodeData).vfpuSize;
  do {
    if (*(char *)tempRegister._40_8_ == '\0') {
      pcVar8 = opcode->name;
      pcVar2 = opcode->encoding;
      iVar3 = opcode->archs;
      iVar4 = opcode->flags;
      uVar5 = *(undefined4 *)&opcode->field_0x1c;
      (this->opcodeData).opcode.destencoding = opcode->destencoding;
      (this->opcodeData).opcode.archs = iVar3;
      (this->opcodeData).opcode.flags = iVar4;
      *(undefined4 *)&(this->opcodeData).opcode.field_0x1c = uVar5;
      (this->opcodeData).opcode.name = pcVar8;
      (this->opcodeData).opcode.encoding = pcVar2;
      setOmittedRegisters(this,opcode);
      pTVar7 = Parser::nextToken(parser);
      this_local._7_1_ = pTVar7->type == Separator;
      goto LAB_001d1558;
    }
    pcVar8 = (char *)(tempRegister._40_8_ + 1);
    switch(*(undefined1 *)tempRegister._40_8_) {
    case 0x43:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseVfpuCondition(this,parser,&(this->opcodeData).vectorCondition);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x44:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseFpuRegister(this,parser,&(this->registers).frd);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    default:
      cVar1 = *(char *)tempRegister._40_8_;
      tempRegister._40_8_ = pcVar8;
      bVar6 = matchSymbol(this,parser,cVar1);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x52:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      switch(*pcVar8) {
      case 'c':
        bVar6 = parseRspVectorControlRegister(this,parser,&(this->registers).grd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 'd':
        bVar6 = parseRspVectorRegister(this,parser,&(this->registers).rspvrd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 'e':
        bVar6 = parseRspVectorElement(this,parser,&(this->registers).rspve);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      default:
        this_local._7_1_ = false;
        goto LAB_001d1558;
      case 'l':
        bVar6 = parseRspScalarElement(this,parser,&(this->registers).rspve);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 'm':
        bVar6 = parseRspScalarElement(this,parser,&(this->registers).rspvde);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 'o':
        bVar6 = parseRspOffsetElement(this,parser,&(this->registers).rspvealt);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 's':
        bVar6 = parseRspVectorRegister(this,parser,&(this->registers).rspvrs);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 't':
        bVar6 = parseRspVectorRegister(this,parser,&(this->registers).rspvrt);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 'z':
        bVar6 = parseRspCop0Register(this,parser,&(this->registers).grd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      break;
    case 0x53:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseFpuRegister(this,parser,&(this->registers).frs);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x54:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseFpuRegister(this,parser,&(this->registers).frt);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x56:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      cVar1 = *pcVar8;
      if (cVar1 == 'd') {
        bVar6 = parsePs2Cop2Register(this,parser,&(this->registers).ps2vrd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      else if (cVar1 == 's') {
        bVar6 = parsePs2Cop2Register(this,parser,&(this->registers).ps2vrs);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      else {
        if (cVar1 != 't') {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        bVar6 = parsePs2Cop2Register(this,parser,&(this->registers).ps2vrt);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      break;
    case 0x57:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      switch(*pcVar8) {
      case 'c':
        bVar6 = parseVcstParameter(this,parser,&(this->immediate).primary.originalValue);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate5;
        break;
      case 'd':
        bVar6 = parseVpfxdParameter(this,parser,&(this->immediate).primary.originalValue);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate16;
        break;
      default:
        this_local._7_1_ = false;
        goto LAB_001d1558;
      case 'r':
        bVar6 = parseVfpuVrot(this,parser,&(this->immediate).primary.originalValue,
                              (this->opcodeData).vfpuSize);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate5;
        break;
      case 's':
        bVar6 = parseVpfxsParameter(this,parser,&(this->immediate).primary.originalValue);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).primary.value = (this->immediate).primary.originalValue;
        (this->immediate).primary.type = Immediate20_0;
      }
      break;
    case 100:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseRegister(this,parser,&(this->registers).grd);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x66:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseFpuControlRegister(this,parser,&(this->registers).frs);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x67:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      cVar1 = *pcVar8;
      if (cVar1 == 'c') {
        bVar6 = parsePsxCop2ControlRegister(this,parser,&(this->registers).grd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      else if (cVar1 == 's') {
        bVar6 = parsePsxCop2DataRegister(this,parser,&(this->registers).grd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      else {
        if (cVar1 != 't') {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        bVar6 = parsePsxCop2DataRegister(this,parser,&(this->registers).grt);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      break;
    case 0x69:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseImmediate(this,parser,&(this->immediate).primary.expression);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      bVar6 = decodeImmediateSize((char **)&tempRegister.num,(MipsImmediateType *)&this->immediate);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x6a:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      switch(*pcVar8) {
      case 'b':
        bVar6 = parseCop2BranchCondition(this,parser,&(this->immediate).secondary.originalValue);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).secondary.type = Cop2BranchType;
        (this->immediate).secondary.value = (this->immediate).secondary.originalValue;
        break;
      case 'c':
        bVar6 = parseImmediate(this,parser,&(this->immediate).secondary.expression);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).secondary.type = CacheOp;
        break;
      default:
        this_local._7_1_ = false;
        goto LAB_001d1558;
      case 'e':
        bVar6 = parseImmediate(this,parser,&(this->immediate).secondary.expression);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).secondary.type = Ext;
        break;
      case 'i':
        bVar6 = parseImmediate(this,parser,&(this->immediate).secondary.expression);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        (this->immediate).secondary.type = Ins;
      }
      break;
    case 0x6d:
      tempRegister._40_8_ = tempRegister._40_8_ + 2;
      cVar1 = *pcVar8;
      if (cVar1 == 'd') {
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrd,(this->opcodeData).vfpuSize);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrd.type != VfpuMatrix) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      else if (cVar1 == 's') {
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrs,(this->opcodeData).vfpuSize);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrs.type != VfpuMatrix) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((opcode->flags & 0x200000U) != 0) {
          (this->registers).vrs.num = (this->registers).vrs.num ^ 0x20;
        }
      }
      else {
        if (cVar1 != 't') {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrt,(this->opcodeData).vfpuSize);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrt.type != VfpuMatrix) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      break;
    case 0x72:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseRegister(this,parser,(MipsRegisterValue *)local_60);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      lVar9 = tempRegister._40_8_ + 1;
      cVar1 = *(char *)tempRegister._40_8_;
      tempRegister._40_8_ = lVar9;
      if (tempRegister.name._name.field_2._8_4_ != (int)cVar1) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x73:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseRegister(this,parser,(MipsRegisterValue *)this);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x74:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseRegister(this,parser,&(this->registers).grt);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x76:
      if (*pcVar8 == 'S') {
        local_64 = 0;
        pcVar8 = (char *)(tempRegister._40_8_ + 2);
      }
      tempRegister._40_8_ = pcVar8;
      lVar9 = tempRegister._40_8_ + 1;
      switch(*(undefined1 *)tempRegister._40_8_) {
      case 99:
        tempRegister._40_8_ = lVar9;
        bVar6 = parseVfpuControlRegister(this,parser,&(this->registers).vrd);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 100:
        tempRegister._40_8_ = lVar9;
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrd,local_64);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrd.type != VfpuVector) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if (((opcode->flags & 0x40000U) != 0) && (((this->registers).vrd.num & 0x40U) != 0)) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      default:
        this_local._7_1_ = false;
        tempRegister._40_8_ = lVar9;
        goto LAB_001d1558;
      case 0x73:
        tempRegister._40_8_ = lVar9;
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrs,local_64);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrs.type != VfpuVector) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if (((opcode->flags & 0x40000U) != 0) && (((this->registers).vrs.num & 0x40U) != 0)) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        break;
      case 0x74:
        tempRegister._40_8_ = lVar9;
        bVar6 = parseVfpuRegister(this,parser,&(this->registers).vrt,local_64);
        if (!bVar6) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if ((this->registers).vrt.type != VfpuVector) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
        if (((opcode->flags & 0x40000U) != 0) && (((this->registers).vrt.num & 0x40U) != 0)) {
          this_local._7_1_ = false;
          goto LAB_001d1558;
        }
      }
      break;
    case 0x77:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseWb(this,parser);
      if (!bVar6) {
        this_local._7_1_ = false;
        goto LAB_001d1558;
      }
      break;
    case 0x7a:
      tempRegister._40_8_ = pcVar8;
      bVar6 = parseCop0Register(this,parser,&(this->registers).grd);
      if (!bVar6) {
        this_local._7_1_ = false;
LAB_001d1558:
        MipsRegisterValue::~MipsRegisterValue((MipsRegisterValue *)local_60);
        return this_local._7_1_;
      }
    }
  } while( true );
}

Assistant:

bool MipsParser::parseParameters(Parser& parser, const tMipsOpcode& opcode)
{
	const char* encoding = opcode.encoding;

	// initialize opcode variables
	immediate.primary.type = MipsImmediateType::None;
	if (!hasFixedSecondaryImmediate)
		immediate.secondary.type = MipsImmediateType::None;

	if (opcodeData.vfpuSize == -1)
	{
		if (opcode.flags & MO_VFPU_SINGLE)
			opcodeData.vfpuSize = 0;
		else if (opcode.flags & MO_VFPU_PAIR)
			opcodeData.vfpuSize = 1;
		else if (opcode.flags & MO_VFPU_TRIPLE)
			opcodeData.vfpuSize = 2;
		else if (opcode.flags & MO_VFPU_QUAD)
			opcodeData.vfpuSize = 3;
	}

	// parse parameters
	MipsRegisterValue tempRegister;
	int actualSize = opcodeData.vfpuSize;

	while (*encoding != 0)
	{
		switch (*encoding++)
		{
		case 't':	// register
			CHECK(parseRegister(parser,registers.grt));
			break;
		case 'd':	// register
			CHECK(parseRegister(parser,registers.grd));
			break;
		case 's':	// register
			CHECK(parseRegister(parser,registers.grs));
			break;
		case 'T':	// float register
			CHECK(parseFpuRegister(parser,registers.frt));
			break;
		case 'D':	// float register
			CHECK(parseFpuRegister(parser,registers.frd));
			break;
		case 'S':	// float register
			CHECK(parseFpuRegister(parser,registers.frs));
			break;
		case 'f':	// fpu control register
			CHECK(parseFpuControlRegister(parser,registers.frs));
			break;
		case 'z':	// cop0 register
			CHECK(parseCop0Register(parser,registers.grd));
			break;
		case 'v':	// psp vfpu reg
			if (*encoding == 'S')
			{
				encoding++;
				actualSize = 0;
			}

			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,actualSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrs.num & 0x40));
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,actualSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrt.num & 0x40));
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,actualSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuVector);
				if (opcode.flags & MO_VFPU_6BIT) CHECK(!(registers.vrd.num & 0x40));
				break;
			case 'c':
				CHECK(parseVfpuControlRegister(parser,registers.vrd));
				break;
			default:
				return false;
			}
			break;
		case 'm':	// vfpu matrix register
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVfpuRegister(parser,registers.vrs,opcodeData.vfpuSize));
				CHECK(registers.vrs.type == MipsRegisterType::VfpuMatrix);
				if (opcode.flags & MO_VFPU_TRANSPOSE_VS)
					registers.vrs.num ^= 0x20;
				break;
			case 't':
				CHECK(parseVfpuRegister(parser,registers.vrt,opcodeData.vfpuSize));
				CHECK(registers.vrt.type == MipsRegisterType::VfpuMatrix);
				break;
			case 'd':
				CHECK(parseVfpuRegister(parser,registers.vrd,opcodeData.vfpuSize));
				CHECK(registers.vrd.type == MipsRegisterType::VfpuMatrix);
				break;
			default:
				return false;
			}
			break;
		case 'V':	// ps2 vector reg
			switch (*encoding++)
			{
			case 't':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrt));
				break;
			case 'd':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrd));
				break;
			case 's':	// register
				CHECK(parsePs2Cop2Register(parser,registers.ps2vrs));
				break;
			default:
				return false;
			}
			break;
		case 'g':	// psx cop2 reg
			switch (*encoding++)
			{
			case 't':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grt));
				break;
			case 's':	// gte data register
				CHECK(parsePsxCop2DataRegister(parser,registers.grd));
				break;
			case 'c':	// gte control register
				CHECK(parsePsxCop2ControlRegister(parser,registers.grd));
				break;
			default:
				return false;
			}
			break;
		case 'r':	// forced register
			CHECK(parseRegister(parser,tempRegister));
			CHECK(tempRegister.num == *encoding++);
			break;
		case 'R':	// rsp register
			switch (*encoding++)
			{
			case 'z':	// cop0 register
				CHECK(parseRspCop0Register(parser,registers.grd));
				break;
			case 'c':	// vector control register
				CHECK(parseRspVectorControlRegister(parser,registers.grd));
				break;
			case 't':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrt));
				break;
			case 'd':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrd));
				break;
			case 's':	// vector register
				CHECK(parseRspVectorRegister(parser,registers.rspvrs));
				break;
			case 'e':	// vector element
				CHECK(parseRspVectorElement(parser,registers.rspve));
				break;
			case 'l':	// scalar element
				CHECK(parseRspScalarElement(parser,registers.rspve));
				break;
			case 'm':	// scalar destination element
				CHECK(parseRspScalarElement(parser,registers.rspvde));
				break;
			case 'o':	// byte offset element
				CHECK(parseRspOffsetElement(parser,registers.rspvealt));
				break;
			default:
				return false;
			}
			break;
		case 'i':	// primary immediate
			CHECK(parseImmediate(parser,immediate.primary.expression));
			CHECK(decodeImmediateSize(encoding,immediate.primary.type));
			break;
		case 'j':	// secondary immediate
			switch (*encoding++)
			{
			case 'c':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::CacheOp;
				break;
			case 'e':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ext;
				break;
			case 'i':
				CHECK(parseImmediate(parser,immediate.secondary.expression));
				immediate.secondary.type = MipsImmediateType::Ins;
				break;
			case 'b':
				CHECK(parseCop2BranchCondition(parser,immediate.secondary.originalValue));
				immediate.secondary.type = MipsImmediateType::Cop2BranchType;
				immediate.secondary.value = immediate.secondary.originalValue;
				break;
			default:
				return false;
			}
			break;
		case 'C':	// vfpu condition
			CHECK(parseVfpuCondition(parser,opcodeData.vectorCondition));
			break;
		case 'W':	// vfpu argument
			switch (*encoding++)
			{
			case 's':
				CHECK(parseVpfxsParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate20_0;
				break;
			case 'd':
				CHECK(parseVpfxdParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate16;
				break;
			case 'c':
				CHECK(parseVcstParameter(parser,immediate.primary.originalValue));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			case 'r':
				CHECK(parseVfpuVrot(parser,immediate.primary.originalValue,opcodeData.vfpuSize));
				immediate.primary.value = immediate.primary.originalValue;
				immediate.primary.type = MipsImmediateType::Immediate5;
				break;
			default:
				return false;
			}
			break;
		case 'w':	// 'wb' characters
			CHECK(parseWb(parser));
			break;
		default:
			CHECK(matchSymbol(parser,*(encoding-1)));
			break;
		}
	}

	opcodeData.opcode = opcode;
	setOmittedRegisters(opcode);

	// the next token has to be a separator, else the parameters aren't
	// completely parsed

	return parser.nextToken().type == TokenType::Separator;

}